

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LLVMNontrappingFPToIntLowering.cpp
# Opt level: O3

void __thiscall
wasm::LLVMNonTrappingFPToIntLowering::run(LLVMNonTrappingFPToIntLowering *this,Module *module)

{
  tuple<wasm::Pass_*,_std::default_delete<wasm::Pass>_> __s;
  PassRunner local_118;
  __uniq_ptr_impl<wasm::Pass,_std::default_delete<wasm::Pass>_> local_28;
  
  if (((module->features).features & 4) != 0) {
    local_118.options.arguments._M_h._M_buckets = &local_118.options.arguments._M_h._M_single_bucket
    ;
    local_118._vptr_PassRunner = (_func_int **)&PTR__PassRunner_010714e0;
    local_118.allocator = &module->allocator;
    local_118.passes.
    super__Vector_base<std::unique_ptr<wasm::Pass,_std::default_delete<wasm::Pass>_>,_std::allocator<std::unique_ptr<wasm::Pass,_std::default_delete<wasm::Pass>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_118.passes.
    super__Vector_base<std::unique_ptr<wasm::Pass,_std::default_delete<wasm::Pass>_>,_std::allocator<std::unique_ptr<wasm::Pass,_std::default_delete<wasm::Pass>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish._0_1_ = 0;
    local_118.passes.
    super__Vector_base<std::unique_ptr<wasm::Pass,_std::default_delete<wasm::Pass>_>,_std::allocator<std::unique_ptr<wasm::Pass,_std::default_delete<wasm::Pass>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish._1_7_ = 0;
    local_118.passes.
    super__Vector_base<std::unique_ptr<wasm::Pass,_std::default_delete<wasm::Pass>_>,_std::allocator<std::unique_ptr<wasm::Pass,_std::default_delete<wasm::Pass>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage._0_1_ = 0;
    local_118._41_8_ = 0;
    local_118.options.validate = true;
    local_118.options.validateGlobally = true;
    local_118.options.optimizeLevel = 0;
    local_118.options.shrinkLevel = 0;
    local_118.options.inlining.alwaysInlineMaxSize = 2;
    local_118.options.inlining.oneCallerInlineMaxSize = 0xffffffff;
    local_118.options.inlining.flexibleInlineMaxSize = 0x14;
    local_118.options.inlining.allowFunctionsWithLoops = false;
    local_118.options.printStackIR.
    super__Optional_base<std::basic_ostream<char,_std::char_traits<char>_>_*,_true,_true>._M_payload
    .super__Optional_payload_base<std::basic_ostream<char,_std::char_traits<char>_>_*>._M_engaged =
         false;
    local_118.options.targetJS = false;
    local_118.options.inlining.partialInliningIfs = 0;
    local_118.options.ignoreImplicitTraps = false;
    local_118.options.trapsNeverHappen = false;
    local_118.options.lowMemoryUnused = false;
    local_118.options.fastMath = false;
    local_118.options.zeroFilledMemory = false;
    local_118.options.closedWorld = false;
    local_118.options.debugInfo = false;
    local_118.options.generateStackIR = false;
    local_118.options.optimizeStackIR = false;
    local_118.options.arguments._M_h._M_bucket_count = 1;
    local_118.options.arguments._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
    local_118.options.arguments._M_h._M_element_count = 0;
    local_118.options.arguments._M_h._M_rehash_policy._M_max_load_factor = 1.0;
    local_118.options.arguments._M_h._M_rehash_policy._M_next_resize = 0;
    local_118.options.arguments._M_h._M_single_bucket = (__node_base_ptr)0x0;
    local_118.options.passesToSkip._M_h._M_buckets =
         &local_118.options.passesToSkip._M_h._M_single_bucket;
    local_118.options.passesToSkip._M_h._M_bucket_count = 1;
    local_118.options.passesToSkip._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
    local_118.options.passesToSkip._M_h._M_element_count = 0;
    local_118.options.passesToSkip._M_h._M_rehash_policy._M_max_load_factor = 1.0;
    local_118.options.passesToSkip._M_h._M_rehash_policy._M_next_resize = 0;
    local_118.options.passesToSkip._M_h._M_single_bucket = (__node_base_ptr)0x0;
    local_118.isNested = false;
    local_118.addedPassesRemovedDWARF = false;
    local_118.wasm = module;
    __s.super__Tuple_impl<0UL,_wasm::Pass_*,_std::default_delete<wasm::Pass>_>.
    super__Head_base<0UL,_wasm::Pass_*,_false>._M_head_impl =
         (_Tuple_impl<0UL,_wasm::Pass_*,_std::default_delete<wasm::Pass>_>)operator_new(0x130);
    memset((void *)__s.super__Tuple_impl<0UL,_wasm::Pass_*,_std::default_delete<wasm::Pass>_>.
                   super__Head_base<0UL,_wasm::Pass_*,_false>._M_head_impl,0,0x110);
    *(long **)((long)__s.super__Tuple_impl<0UL,_wasm::Pass_*,_std::default_delete<wasm::Pass>_>.
                     super__Head_base<0UL,_wasm::Pass_*,_false>._M_head_impl + 0x10) =
         (long *)((long)__s.super__Tuple_impl<0UL,_wasm::Pass_*,_std::default_delete<wasm::Pass>_>.
                        super__Head_base<0UL,_wasm::Pass_*,_false>._M_head_impl + 0x20);
    *(long *)((long)__s.super__Tuple_impl<0UL,_wasm::Pass_*,_std::default_delete<wasm::Pass>_>.
                    super__Head_base<0UL,_wasm::Pass_*,_false>._M_head_impl + 0x58) = 0;
    *(long *)((long)__s.super__Tuple_impl<0UL,_wasm::Pass_*,_std::default_delete<wasm::Pass>_>.
                    super__Head_base<0UL,_wasm::Pass_*,_false>._M_head_impl + 0x60) = 0;
    *(long *)((long)__s.super__Tuple_impl<0UL,_wasm::Pass_*,_std::default_delete<wasm::Pass>_>.
                    super__Head_base<0UL,_wasm::Pass_*,_false>._M_head_impl + 0x108) = 0;
    *(long *)((long)__s.super__Tuple_impl<0UL,_wasm::Pass_*,_std::default_delete<wasm::Pass>_>.
                    super__Head_base<0UL,_wasm::Pass_*,_false>._M_head_impl + 0x110) = 0;
    *(long *)((long)__s.super__Tuple_impl<0UL,_wasm::Pass_*,_std::default_delete<wasm::Pass>_>.
                    super__Head_base<0UL,_wasm::Pass_*,_false>._M_head_impl + 0x118) = 0;
    *(long *)((long)__s.super__Tuple_impl<0UL,_wasm::Pass_*,_std::default_delete<wasm::Pass>_>.
                    super__Head_base<0UL,_wasm::Pass_*,_false>._M_head_impl + 0x120) = 0;
    *(long *)((long)__s.super__Tuple_impl<0UL,_wasm::Pass_*,_std::default_delete<wasm::Pass>_>.
                    super__Head_base<0UL,_wasm::Pass_*,_false>._M_head_impl + 0x128) = 0;
    *(undefined ***)
     __s.super__Tuple_impl<0UL,_wasm::Pass_*,_std::default_delete<wasm::Pass>_>.
     super__Head_base<0UL,_wasm::Pass_*,_false>._M_head_impl = &PTR__WalkerPass_010740f8;
    local_28._M_t.super__Tuple_impl<0UL,_wasm::Pass_*,_std::default_delete<wasm::Pass>_>.
    super__Head_base<0UL,_wasm::Pass_*,_false>._M_head_impl =
         (tuple<wasm::Pass_*,_std::default_delete<wasm::Pass>_>)
         (tuple<wasm::Pass_*,_std::default_delete<wasm::Pass>_>)
         __s.super__Tuple_impl<0UL,_wasm::Pass_*,_std::default_delete<wasm::Pass>_>.
         super__Head_base<0UL,_wasm::Pass_*,_false>._M_head_impl;
    PassRunner::add(&local_118,(unique_ptr<wasm::Pass,_std::default_delete<wasm::Pass>_> *)&local_28
                   );
    if ((_Tuple_impl<0UL,_wasm::Pass_*,_std::default_delete<wasm::Pass>_>)
        local_28._M_t.super__Tuple_impl<0UL,_wasm::Pass_*,_std::default_delete<wasm::Pass>_>.
        super__Head_base<0UL,_wasm::Pass_*,_false>._M_head_impl != (Pass *)0x0) {
      (**(code **)(*(long *)local_28._M_t.
                            super__Tuple_impl<0UL,_wasm::Pass_*,_std::default_delete<wasm::Pass>_>.
                            super__Head_base<0UL,_wasm::Pass_*,_false>._M_head_impl + 8))();
    }
    local_28._M_t.super__Tuple_impl<0UL,_wasm::Pass_*,_std::default_delete<wasm::Pass>_>.
    super__Head_base<0UL,_wasm::Pass_*,_false>._M_head_impl =
         (tuple<wasm::Pass_*,_std::default_delete<wasm::Pass>_>)
         (_Tuple_impl<0UL,_wasm::Pass_*,_std::default_delete<wasm::Pass>_>)0x0;
    local_118.isNested = true;
    PassRunner::run(&local_118);
    *(byte *)&(module->features).features = (byte)(module->features).features & 0xfb;
    PassRunner::~PassRunner(&local_118);
  }
  return;
}

Assistant:

void run(Module* module) override {
    if (!module->features.hasTruncSat()) {
      return;
    }
    PassRunner runner(module);
    // Run the Impl pass as an inner pass in parallel. This pass updates the
    // module features, so it can't be parallel.
    runner.add(std::make_unique<LLVMNonTrappingFPToIntLoweringImpl>());
    runner.setIsNested(true);
    runner.run();
    module->features.disable(FeatureSet::TruncSat);
  }